

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O1

base_learner * boosting_setup(options_i *options,vw *all)

{
  string *location;
  pointer pfVar1;
  long lVar2;
  int iVar3;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar6;
  long *plVar7;
  ostream *poVar8;
  base_learner *pbVar9;
  single_learner *psVar10;
  learner<boosting,_example> *plVar11;
  code *pcVar12;
  vw_exception *this;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew_1;
  stringstream __msg;
  size_type __dnew;
  boosting *local_668;
  long *local_648;
  long local_640;
  long local_638 [2];
  _func_int ***local_628;
  _func_int **local_620;
  _func_int **local_618 [2];
  pointer *local_608;
  pointer local_600;
  pointer local_5f8 [2];
  long local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  option_group_definition local_560;
  undefined8 *local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined1 local_510;
  string local_508;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  undefined1 local_448 [16];
  undefined1 local_438 [32];
  string local_418 [64];
  bool local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3b0;
  typed_option<float> local_2b8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<float> local_170;
  typed_option<int> local_d0;
  
  local_668 = calloc_or_throw<boosting>(1);
  local_668->N = 0;
  local_668->gamma = 0.0;
  (local_668->alg)._M_dataplus._M_p = (pointer)0x0;
  (local_668->alg)._M_string_length = 0;
  (local_668->alg).field_2._M_allocated_capacity = 0;
  (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&local_668->t = 0;
  *(undefined8 *)((long)&(local_668->alg).field_2 + 8) = 0;
  local_668->all = (vw *)0x0;
  (local_668->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_668->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_668->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_668->alg)._M_dataplus._M_p = (pointer)&(local_668->alg).field_2;
  (local_668->alg)._M_string_length = 0;
  (local_668->alg).field_2._M_local_buf[0] = '\0';
  (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_518 = 0x676e6974736f6f42;
  local_520 = 8;
  local_510 = 0;
  local_560.m_name._M_dataplus._M_p = (pointer)&local_560.m_name.field_2;
  local_528 = &local_518;
  std::__cxx11::string::_M_construct<char*>((string *)&local_560,&local_518);
  local_560.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_560.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_560.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_528 != &local_518) {
    operator_delete(local_528);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  local_580.field_2._M_allocated_capacity = 0x676e6974736f6f62;
  local_580._M_string_length = 8;
  local_580.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)local_448,&local_580,&local_668->N);
  local_3d8 = true;
  local_608 = local_5f8;
  local_2b8.super_base_option._vptr_base_option = (_func_int **)0x26;
  local_608 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_608,(ulong)&local_2b8);
  local_5f8[0] = (pointer)local_2b8.super_base_option._vptr_base_option;
  local_608[2] = (pointer)0x3e4e3c2068746977;
  local_608[3] = (pointer)0x656c206b61657720;
  *local_608 = (pointer)0x6220656e696c6e4f;
  local_608[1] = (pointer)0x20676e6974736f6f;
  builtin_strncpy((char *)((long)local_608 + 0x1e),"learners",8);
  local_600 = (pointer)local_2b8.super_base_option._vptr_base_option;
  *(char *)((long)local_608 + (long)local_2b8.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign(local_418);
  VW::config::typed_option<int>::typed_option(&local_d0,(typed_option<int> *)local_448);
  poVar4 = VW::config::option_group_definition::add<int>(&local_560,&local_d0);
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  local_5a0.field_2._M_allocated_capacity._0_4_ = 0x6d6d6167;
  local_5a0.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_5a0._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_2b8,&local_5a0,&local_668->gamma);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_2b8,0.1);
  local_628 = local_618;
  local_4e8.super_base_option._vptr_base_option = (_func_int **)0x33;
  local_628 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_628,(ulong)&local_4e8);
  local_618[0] = local_4e8.super_base_option._vptr_base_option;
  local_628[4] = (_func_int **)0x796220796c6e6f20;
  local_628[5] = (_func_int **)0x20656e696c6e6f20;
  local_628[2] = (_func_int **)0x2e303d2820656764;
  local_628[3] = (_func_int **)0x64657375202c2931;
  *local_628 = (_func_int **)0x61656c206b616577;
  local_628[1] = (_func_int **)0x6520732772656e72;
  builtin_strncpy((char *)((long)local_628 + 0x2f)," BBM",4);
  local_620 = local_4e8.super_base_option._vptr_base_option;
  *(char *)((long)local_628 + (long)local_4e8.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_170,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_170);
  location = &local_668->alg;
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  local_5c0.field_2._M_allocated_capacity._0_4_ = 0x676c61;
  local_5c0._M_string_length = 3;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_4e8,&local_5c0,location);
  local_4e8.super_base_option.m_keep = true;
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  local_5e0.field_2._M_allocated_capacity._0_4_ = 0x4d4242;
  local_5e0._M_string_length = 3;
  ptVar6 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_4e8,&local_5e0);
  local_648 = local_638;
  local_5e8 = 0x5f;
  plVar7 = (long *)std::__cxx11::string::_M_create((ulong *)&local_648,(ulong)&local_5e8);
  lVar2 = local_5e8;
  local_638[0] = local_5e8;
  local_648 = plVar7;
  memcpy(plVar7,
         "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
         ,0x5f);
  local_640 = lVar2;
  *(undefined1 *)((long)plVar7 + lVar2) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,ptVar6);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_648 != local_638) {
    operator_delete(local_648);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p);
  }
  local_4e8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_4e8.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4e8.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_4e8.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4e8.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_4e8.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_628 != local_618) {
    operator_delete(local_628);
  }
  local_2b8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb0f8;
  if (local_2b8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b8.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb998;
  if (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_608 != local_5f8) {
    operator_delete(local_608);
  }
  local_448._0_8_ = &PTR__typed_option_002cb998;
  if (local_3b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3b0._M_pi);
  }
  if (local_3c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_560);
  local_438._0_8_ = (pointer)0x676e6974736f6f62;
  local_448._8_8_ = (pointer)0x8;
  local_438[8] = '\0';
  local_448._0_8_ = (pointer)local_438;
  iVar3 = (*options->_vptr_options_i[1])(options,local_448);
  if ((pointer)local_448._0_8_ != (pointer)local_438) {
    operator_delete((void *)local_448._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar11 = (learner<boosting,_example> *)0x0;
  }
  else {
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of weak learners = ",0x1a);
      plVar7 = (long *)std::ostream::operator<<(&std::cerr,local_668->N);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
    }
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Gamma = ",8);
      poVar8 = std::ostream::_M_insert<double>((double)local_668->gamma);
      std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    iVar3 = local_668->N;
    local_608 = (pointer *)0xffffffffffffffff;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_4e8,(long)local_668->N,
               (value_type_conflict6 *)&local_608,(allocator_type *)&local_628);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&local_2b8,(long)iVar3,(value_type *)&local_4e8,(allocator_type *)&local_648);
    local_448._0_8_ =
         (local_668->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_448._8_8_ =
         (local_668->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_438._0_8_ =
         (local_668->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_668->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_2b8.super_base_option._vptr_base_option;
    (local_668->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_2b8.super_base_option.m_name._M_dataplus._M_p;
    (local_668->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_2b8.super_base_option.m_name._M_string_length;
    local_2b8.super_base_option._vptr_base_option = (_func_int **)0x0;
    local_2b8.super_base_option.m_name._M_dataplus._M_p = (pointer)0x0;
    local_2b8.super_base_option.m_name._M_string_length = 0;
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)local_448);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&local_2b8);
    if (local_4e8.super_base_option._vptr_base_option != (_func_int **)0x0) {
      operator_delete(local_4e8.super_base_option._vptr_base_option);
    }
    local_668->t = 0;
    local_668->all = all;
    local_2b8.super_base_option._vptr_base_option =
         (_func_int **)((ulong)local_2b8.super_base_option._vptr_base_option & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_448,(long)local_668->N,
               (value_type_conflict3 *)&local_2b8,(allocator_type *)&local_4e8);
    pfVar1 = (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_448._0_8_;
    (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_448._8_8_;
    (local_668->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_438._0_8_;
    local_448._0_8_ = (pointer)0x0;
    local_448._8_8_ = (pointer)0x0;
    local_438._0_8_ = (pointer)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    if ((pointer)local_448._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_448._0_8_);
    }
    local_2b8.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_2b8.super_base_option._vptr_base_option._4_4_,0x3f800000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_448,(long)local_668->N,
               (value_type_conflict3 *)&local_2b8,(allocator_type *)&local_4e8);
    pfVar1 = (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)local_448._0_8_;
    (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)local_448._8_8_;
    (local_668->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)local_438._0_8_;
    local_448._0_8_ = (pointer)0x0;
    local_448._8_8_ = (pointer)0x0;
    local_438._0_8_ = (pointer)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    if ((pointer)local_448._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_448._0_8_);
    }
    iVar3 = std::__cxx11::string::compare((char *)location);
    if (iVar3 == 0) {
      pbVar9 = setup_base(options,all);
      psVar10 = LEARNER::as_singleline<char,char>(pbVar9);
      plVar11 = LEARNER::learner<boosting,example>::init_learner<LEARNER::learner<char,example>>
                          (local_668,psVar10,predict_or_learn<true>,predict_or_learn<false>,
                           (long)local_668->N,*(prediction_type_t *)(psVar10 + 0xd0));
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)location);
      if (iVar3 == 0) {
        pbVar9 = setup_base(options,all);
        psVar10 = LEARNER::as_singleline<char,char>(pbVar9);
        plVar11 = LEARNER::learner<boosting,example>::init_learner<LEARNER::learner<char,example>>
                            (local_668,psVar10,predict_or_learn_logistic<true>,
                             predict_or_learn_logistic<false>,(long)local_668->N,
                             *(prediction_type_t *)(psVar10 + 0xd0));
        pcVar12 = save_load;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)location);
        if (iVar3 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_448);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"Unrecognized boosting algorithm: \'",0x22);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_438,(local_668->alg)._M_dataplus._M_p,
                              (local_668->alg)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' Bailing!",10);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/boosting.cc"
                     ,0x1c3,&local_508);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pbVar9 = setup_base(options,all);
        psVar10 = LEARNER::as_singleline<char,char>(pbVar9);
        plVar11 = LEARNER::learner<boosting,example>::init_learner<LEARNER::learner<char,example>>
                            (local_668,psVar10,predict_or_learn_adaptive<true>,
                             predict_or_learn_adaptive<false>,(long)local_668->N,
                             *(prediction_type_t *)(psVar10 + 0xd0));
        pcVar12 = save_load_sampling;
      }
      *(code **)(plVar11 + 0x80) = pcVar12;
      *(undefined8 *)(plVar11 + 0x70) = *(undefined8 *)(plVar11 + 0x18);
      *(undefined8 *)(plVar11 + 0x78) = *(undefined8 *)(plVar11 + 0x20);
    }
    *(undefined8 *)(plVar11 + 0xb8) = *(undefined8 *)(plVar11 + 0x18);
    *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 200) = finish;
    *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
    *(code **)(plVar11 + 0x68) = return_example;
    local_668 = (boosting *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_560.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560.m_name._M_dataplus._M_p != &local_560.m_name.field_2) {
    operator_delete(local_560.m_name._M_dataplus._M_p);
  }
  if (local_668 != (boosting *)0x0) {
    destroy_free<boosting>(local_668);
  }
  return (base_learner *)plVar11;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}